

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O0

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlySetup
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  long in_RDI;
  btScalar bVar1;
  btAlignedObjectArray<float> *in_stack_00000010;
  btScalar val;
  btTypedConstraint **in_stack_00000898;
  int in_stack_000008a4;
  btPersistentManifold **in_stack_000008a8;
  int in_stack_000008b4;
  btCollisionObject **in_stack_000008b8;
  btSequentialImpulseConstraintSolver *in_stack_000008c0;
  int in_stack_000008d0;
  btContactSolverInfo *in_stack_000008d8;
  btIDebugDraw *in_stack_000008e0;
  int in_stack_ffffffffffffff6c;
  
  bVar1 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
                    (in_stack_000008c0,in_stack_000008b8,in_stack_000008b4,in_stack_000008a8,
                     in_stack_000008a4,in_stack_00000898,in_stack_000008d0,in_stack_000008d8,
                     in_stack_000008e0);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x28));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x68));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x88));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x48));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x28));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x68));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  btAlignedObjectArray<btSolverConstraint>::size
            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0x88));
  btAlignedObjectArray<float>::resizeNoInitialize(in_stack_00000010,in_stack_ffffffffffffff6c);
  return bVar1;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	btScalar val = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup( bodies,numBodies,manifoldPtr, numManifolds, constraints,numConstraints,infoGlobal,debugDrawer);

	m_pNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_pC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_pCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_pCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	m_deltafNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_deltafC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_deltafCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_deltafCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	return val;
}